

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_ext.hpp
# Opt level: O3

void detail::for_each_type<$18b53023$>::execute(string *paramName)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_158 [2];
  long local_148 [2];
  string local_138;
  SourceLineInfo local_118;
  SectionInfo local_108;
  Section local_b8;
  
  local_118.file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/test/include/catch_ext.hpp"
  ;
  local_118.line = 0x31;
  pcVar1 = (paramName->_M_dataplus)._M_p;
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_158,pcVar1,pcVar1 + paramName->_M_string_length);
  std::__cxx11::string::append((char *)local_158);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_158);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_138.field_2._M_allocated_capacity = *psVar4;
    local_138.field_2._8_8_ = plVar3[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar4;
    local_138._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_138._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Catch::SectionInfo::SectionInfo(&local_108,&local_118,&local_138);
  Catch::Section::Section(&local_b8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.description._M_dataplus._M_p != &local_108.description.field_2) {
    operator_delete(local_108.description._M_dataplus._M_p,
                    local_108.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
    operator_delete(local_108.name._M_dataplus._M_p,local_108.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0],local_148[0] + 1);
  }
  bVar2 = Catch::Section::operator_cast_to_bool(&local_b8);
  if (bVar2) {
    ____C_A_T_C_H____T_E_S_T___E_X_T_E_N_S_I_O_N____64<custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>
    ::execute();
  }
  Catch::Section::~Section(&local_b8);
  for_each_type<$c8ef4663$>::execute(paramName);
  return;
}

Assistant:

static void execute(const std::string& paramName)
  {

    SECTION(paramName + "=" + typeid(T).name()) { Func<T>::execute(); }
    for_each_type<Func, Ts...>::execute(paramName);
  }